

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O0

void UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  short sVar1;
  UChar UVar2;
  UChar *pUVar3;
  uint8_t *puVar4;
  void *pvVar5;
  UConverter *pUVar6;
  int iVar7;
  bool bVar8;
  uint8_t uVar9;
  UBool UVar12;
  char cVar13;
  uint uVar14;
  UChar *pUVar15;
  uchar *puVar16;
  uint8_t *puVar17;
  uint32_t local_78;
  uint32_t uStack_74;
  UChar trail;
  int32_t offset_4;
  int32_t offset_3;
  int32_t offset_2;
  uint32_t temp;
  int32_t offset_1;
  int32_t offset;
  UBool deltaChanged;
  uint16_t range;
  uint16_t newDelta;
  UConverterDataISCII *converterData;
  uint local_48;
  UChar32 tempContextFromUnicode;
  UChar32 sourceChar;
  uint32_t targetByteUnit;
  int32_t *offsets;
  uchar *targetLimit;
  uchar *target;
  UChar *sourceLimit;
  UChar *source;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  uint8_t uVar10;
  uint8_t uVar11;
  
  sourceLimit = args->source;
  pUVar3 = args->sourceLimit;
  targetLimit = (uchar *)args->target;
  puVar4 = (uint8_t *)args->targetLimit;
  _sourceChar = (uint32_t *)args->offsets;
  bVar8 = false;
  if (((args->converter == (UConverter *)0x0) || (args->targetLimit < args->target)) ||
     (args->sourceLimit < args->source)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    pvVar5 = args->converter->extraInfo;
    offset._0_2_ = *(ushort *)((long)pvVar5 + 6) / 0x80;
    local_48 = args->converter->fromUChar32;
    if (local_48 == 0) {
LAB_0038a488:
      do {
        while( true ) {
          if (pUVar3 <= sourceLimit) goto LAB_0038b545;
          if (args->converter->fromUnicodeStatus == 10) {
            uVar14 = (lookupInitialData[(ushort)offset].isciiLang & 0xff) + 0xef00;
            args->converter->fromUnicodeStatus = 0;
            iVar7 = (int)((long)sourceLimit - (long)args->source >> 1);
            temp = iVar7 - 1;
            uVar9 = (uint8_t)(uVar14 >> 0x10);
            uVar10 = (uint8_t)uVar14;
            uVar11 = (uint8_t)(uVar14 >> 8);
            if (targetLimit < puVar4) {
              if (uVar14 < 0x100) {
                puVar16 = targetLimit + 1;
                *targetLimit = uVar10;
                targetLimit = puVar16;
                if (_sourceChar != (uint32_t *)0x0) {
                  *_sourceChar = temp;
                  _sourceChar = _sourceChar + 1;
                }
              }
              else {
                if (0xffff < uVar14) {
                  puVar16 = targetLimit + 1;
                  *targetLimit = uVar9;
                  targetLimit = puVar16;
                  if (_sourceChar != (uint32_t *)0x0) {
                    temp = iVar7 - 2;
                    *_sourceChar = temp;
                    _sourceChar = _sourceChar + 1;
                  }
                }
                if (targetLimit < puVar4) {
                  puVar17 = targetLimit + 1;
                  *targetLimit = uVar11;
                  if (_sourceChar != (uint32_t *)0x0) {
                    *_sourceChar = temp;
                    _sourceChar = _sourceChar + 1;
                  }
                  if (puVar17 < puVar4) {
                    targetLimit = targetLimit + 2;
                    *puVar17 = uVar10;
                    if (_sourceChar != (uint32_t *)0x0) {
                      *_sourceChar = temp;
                      _sourceChar = _sourceChar + 1;
                    }
                  }
                  else {
                    pUVar6 = args->converter;
                    cVar13 = args->converter->charErrorBufferLength;
                    args->converter->charErrorBufferLength = cVar13 + '\x01';
                    pUVar6->charErrorBuffer[cVar13] = uVar10;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    targetLimit = puVar17;
                  }
                }
                else {
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar11;
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar10;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
              }
            }
            else {
              if ((uVar14 & 0xff0000) != 0) {
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
              }
              if ((uVar14 & 0xff00) != 0) {
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar11;
              }
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar10;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            UVar12 = U_FAILURE(*err);
            if (UVar12 != '\0') goto LAB_0038b545;
          }
          pUVar15 = sourceLimit + 1;
          UVar2 = *sourceLimit;
          local_48 = (uint)(ushort)UVar2;
          sVar1 = *(short *)((long)pvVar5 + 2);
          tempContextFromUnicode = 0xffff;
          sourceLimit = pUVar15;
          if (0xa0 < local_48) break;
          args->converter->fromUnicodeStatus = local_48;
          iVar7 = (int)((long)pUVar15 - (long)args->source >> 1);
          offset_2 = iVar7 - 1;
          uVar9 = (uint8_t)UVar2;
          uVar10 = (uint8_t)((ushort)UVar2 >> 8);
          if (targetLimit < puVar4) {
            if (local_48 < 0x100) {
              puVar16 = targetLimit + 1;
              *targetLimit = uVar9;
              targetLimit = puVar16;
              if (_sourceChar != (uint32_t *)0x0) {
                *_sourceChar = offset_2;
                _sourceChar = _sourceChar + 1;
              }
            }
            else {
              if (0xffff < local_48) {
                puVar16 = targetLimit + 1;
                *targetLimit = '\0';
                targetLimit = puVar16;
                if (_sourceChar != (uint32_t *)0x0) {
                  offset_2 = iVar7 - 2;
                  *_sourceChar = offset_2;
                  _sourceChar = _sourceChar + 1;
                }
              }
              if (targetLimit < puVar4) {
                puVar17 = targetLimit + 1;
                *targetLimit = uVar10;
                if (_sourceChar != (uint32_t *)0x0) {
                  *_sourceChar = offset_2;
                  _sourceChar = _sourceChar + 1;
                }
                if (puVar17 < puVar4) {
                  targetLimit = targetLimit + 2;
                  *puVar17 = uVar9;
                  if (_sourceChar != (uint32_t *)0x0) {
                    *_sourceChar = offset_2;
                    _sourceChar = _sourceChar + 1;
                  }
                }
                else {
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar9;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                  targetLimit = puVar17;
                }
              }
              else {
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar10;
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
            }
          }
          else {
            if ((UVar2 & 0xff00U) != 0) {
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar10;
            }
            pUVar6 = args->converter;
            cVar13 = args->converter->charErrorBufferLength;
            args->converter->charErrorBufferLength = cVar13 + '\x01';
            pUVar6->charErrorBuffer[cVar13] = uVar9;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          cVar13 = U_FAILURE(*err);
joined_r0x0038b1ca:
          if (cVar13 != '\0') goto LAB_0038b545;
        }
        if (local_48 == 0x200c) {
          if (*(short *)((long)pvVar5 + 2) == 0) {
            *(undefined2 *)((long)pvVar5 + 2) = 0;
            goto LAB_0038a488;
          }
          *(undefined2 *)((long)pvVar5 + 2) = 0;
          tempContextFromUnicode = 0xe8;
        }
        else if (local_48 == 0x200d) {
          if (*(short *)((long)pvVar5 + 2) == 0) {
            tempContextFromUnicode = 0xd9;
          }
          else {
            tempContextFromUnicode = 0xe9;
          }
          *(undefined2 *)((long)pvVar5 + 2) = 0;
        }
        else {
          if ((0xd7f - local_48 & 0xffff) < 0x480) {
            if ((local_48 != 0x964) && (local_48 != 0x965)) {
              offset._0_2_ = (ushort)((int)(local_48 - 0x900) / 0x80);
              if (((ushort)((ushort)offset << 7) != *(short *)((long)pvVar5 + 6)) ||
                 (*(char *)((long)pvVar5 + 0x18) != '\0')) {
                *(ushort *)((long)pvVar5 + 6) = (ushort)offset << 7;
                *(MaskEnum *)((long)pvVar5 + 0xc) = lookupInitialData[(ushort)offset].maskEnum;
                bVar8 = true;
                *(undefined1 *)((long)pvVar5 + 0x18) = 0;
              }
              if (*(short *)((long)pvVar5 + 6) == 0x100) {
                if (local_48 == 0xa70) {
                  local_48 = 0xa02;
                }
                else if (local_48 == 0xa71) {
                  *(undefined2 *)((long)pvVar5 + 2) = 0xa71;
                }
              }
              local_48 = local_48 - *(ushort *)((long)pvVar5 + 6);
            }
            tempContextFromUnicode = (UChar32)fromUnicodeTable[local_48 & 0xff];
            if ((((uint)""[local_48 & 0xff] & *(uint *)((long)pvVar5 + 0xc)) == 0) &&
               ((*(short *)((long)pvVar5 + 6) != 0x300 || (local_48 != 0x931)))) {
              tempContextFromUnicode = 0xffff;
            }
            if (bVar8) {
              uVar14 = (lookupInitialData[(ushort)offset].isciiLang & 0xff) + 0xef00;
              bVar8 = false;
              iVar7 = (int)((long)pUVar15 - (long)args->source >> 1);
              offset_4 = iVar7 - 1;
              uVar9 = (uint8_t)(uVar14 >> 0x10);
              uVar10 = (uint8_t)uVar14;
              uVar11 = (uint8_t)(uVar14 >> 8);
              if (targetLimit < puVar4) {
                if (uVar14 < 0x100) {
                  puVar16 = targetLimit + 1;
                  *targetLimit = uVar10;
                  targetLimit = puVar16;
                  if (_sourceChar != (uint32_t *)0x0) {
                    *_sourceChar = offset_4;
                    _sourceChar = _sourceChar + 1;
                  }
                }
                else {
                  if (0xffff < uVar14) {
                    puVar16 = targetLimit + 1;
                    *targetLimit = uVar9;
                    targetLimit = puVar16;
                    if (_sourceChar != (uint32_t *)0x0) {
                      offset_4 = iVar7 - 2;
                      *_sourceChar = offset_4;
                      _sourceChar = _sourceChar + 1;
                    }
                  }
                  if (targetLimit < puVar4) {
                    puVar17 = targetLimit + 1;
                    *targetLimit = uVar11;
                    if (_sourceChar != (uint32_t *)0x0) {
                      *_sourceChar = offset_4;
                      _sourceChar = _sourceChar + 1;
                    }
                    if (puVar17 < puVar4) {
                      targetLimit = targetLimit + 2;
                      *puVar17 = uVar10;
                      if (_sourceChar != (uint32_t *)0x0) {
                        *_sourceChar = offset_4;
                        _sourceChar = _sourceChar + 1;
                      }
                    }
                    else {
                      pUVar6 = args->converter;
                      cVar13 = args->converter->charErrorBufferLength;
                      args->converter->charErrorBufferLength = cVar13 + '\x01';
                      pUVar6->charErrorBuffer[cVar13] = uVar10;
                      *err = U_BUFFER_OVERFLOW_ERROR;
                      targetLimit = puVar17;
                    }
                  }
                  else {
                    pUVar6 = args->converter;
                    cVar13 = args->converter->charErrorBufferLength;
                    args->converter->charErrorBufferLength = cVar13 + '\x01';
                    pUVar6->charErrorBuffer[cVar13] = uVar11;
                    pUVar6 = args->converter;
                    cVar13 = args->converter->charErrorBufferLength;
                    args->converter->charErrorBufferLength = cVar13 + '\x01';
                    pUVar6->charErrorBuffer[cVar13] = uVar10;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                }
              }
              else {
                if ((uVar14 & 0xff0000) != 0) {
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar9;
                }
                if ((uVar14 & 0xff00) != 0) {
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar11;
                }
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar10;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              UVar12 = U_FAILURE(*err);
              if (UVar12 != '\0') goto LAB_0038aef2;
            }
            if ((*(short *)((long)pvVar5 + 6) == 0x100) && (local_48 == 0x971)) goto LAB_0038a488;
          }
          *(undefined2 *)((long)pvVar5 + 2) = 0;
        }
LAB_0038aef2:
        uVar9 = (uint8_t)tempContextFromUnicode;
        if (((*(short *)((long)pvVar5 + 6) == 0x100) && (sVar1 == 0xa71)) &&
           (UVar12 = isPNJConsonant(local_48 + 0x100), UVar12 != '\0')) {
          *(undefined2 *)((long)pvVar5 + 2) = 0;
          uVar14 = tempContextFromUnicode << 0x10 | 0xe800U | tempContextFromUnicode;
          iVar7 = (int)((long)pUVar15 - (long)args->source >> 1);
          uStack_74 = iVar7 - 1;
          uVar10 = (uint8_t)(uVar14 >> 8);
          if (targetLimit < puVar4) {
            if (uVar14 < 0x100) {
              puVar16 = targetLimit + 1;
              *targetLimit = uVar9;
              targetLimit = puVar16;
              if (_sourceChar != (uint32_t *)0x0) {
                *_sourceChar = uStack_74;
                _sourceChar = _sourceChar + 1;
              }
            }
            else {
              if (0xffff < uVar14) {
                puVar16 = targetLimit + 1;
                *targetLimit = uVar9;
                targetLimit = puVar16;
                if (_sourceChar != (uint32_t *)0x0) {
                  uStack_74 = iVar7 - 2;
                  *_sourceChar = uStack_74;
                  _sourceChar = _sourceChar + 1;
                }
              }
              if (targetLimit < puVar4) {
                puVar17 = targetLimit + 1;
                *targetLimit = uVar10;
                if (_sourceChar != (uint32_t *)0x0) {
                  *_sourceChar = uStack_74;
                  _sourceChar = _sourceChar + 1;
                }
                if (puVar17 < puVar4) {
                  targetLimit = targetLimit + 2;
                  *puVar17 = uVar9;
                  if (_sourceChar != (uint32_t *)0x0) {
                    *_sourceChar = uStack_74;
                    _sourceChar = _sourceChar + 1;
                  }
                }
                else {
                  pUVar6 = args->converter;
                  cVar13 = args->converter->charErrorBufferLength;
                  args->converter->charErrorBufferLength = cVar13 + '\x01';
                  pUVar6->charErrorBuffer[cVar13] = uVar9;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                  targetLimit = puVar17;
                }
              }
              else {
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar10;
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
            }
          }
          else {
            if ((tempContextFromUnicode << 0x10 & 0xff0000U) != 0) {
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar9;
            }
            if ((uVar14 & 0xff00) != 0) {
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar10;
            }
            pUVar6 = args->converter;
            cVar13 = args->converter->charErrorBufferLength;
            args->converter->charErrorBufferLength = cVar13 + '\x01';
            pUVar6->charErrorBuffer[cVar13] = uVar9;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          cVar13 = U_FAILURE(*err);
          goto joined_r0x0038b1ca;
        }
        if (tempContextFromUnicode == 0xffff) {
          if ((local_48 & 0xfffff800) == 0xd800) {
            if ((local_48 & 0x400) == 0) goto LAB_0038b4af;
            *err = U_ILLEGAL_CHAR_FOUND;
          }
          else {
            *err = U_INVALID_CHAR_FOUND;
          }
          goto LAB_0038b52e;
        }
        if (tempContextFromUnicode == 0xe8) {
          *(undefined2 *)((long)pvVar5 + 2) = 0xe8;
        }
        iVar7 = (int)((long)pUVar15 - (long)args->source >> 1);
        local_78 = iVar7 - 1;
        uVar10 = (uint8_t)((uint)tempContextFromUnicode >> 8);
        if (targetLimit < puVar4) {
          if ((uint)tempContextFromUnicode < 0x100) {
            puVar16 = targetLimit + 1;
            *targetLimit = uVar9;
            targetLimit = puVar16;
            if (_sourceChar != (uint32_t *)0x0) {
              *_sourceChar = local_78;
              _sourceChar = _sourceChar + 1;
            }
          }
          else {
            if (0xffff < (uint)tempContextFromUnicode) {
              puVar16 = targetLimit + 1;
              *targetLimit = '\0';
              targetLimit = puVar16;
              if (_sourceChar != (uint32_t *)0x0) {
                local_78 = iVar7 - 2;
                *_sourceChar = local_78;
                _sourceChar = _sourceChar + 1;
              }
            }
            if (targetLimit < puVar4) {
              puVar17 = targetLimit + 1;
              *targetLimit = uVar10;
              if (_sourceChar != (uint32_t *)0x0) {
                *_sourceChar = local_78;
                _sourceChar = _sourceChar + 1;
              }
              if (puVar17 < puVar4) {
                targetLimit = targetLimit + 2;
                *puVar17 = uVar9;
                if (_sourceChar != (uint32_t *)0x0) {
                  *_sourceChar = local_78;
                  _sourceChar = _sourceChar + 1;
                }
              }
              else {
                pUVar6 = args->converter;
                cVar13 = args->converter->charErrorBufferLength;
                args->converter->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
                *err = U_BUFFER_OVERFLOW_ERROR;
                targetLimit = puVar17;
              }
            }
            else {
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar10;
              pUVar6 = args->converter;
              cVar13 = args->converter->charErrorBufferLength;
              args->converter->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar9;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
          }
        }
        else {
          if ((tempContextFromUnicode & 0xff00U) != 0) {
            pUVar6 = args->converter;
            cVar13 = args->converter->charErrorBufferLength;
            args->converter->charErrorBufferLength = cVar13 + '\x01';
            pUVar6->charErrorBuffer[cVar13] = uVar10;
          }
          pUVar6 = args->converter;
          cVar13 = args->converter->charErrorBufferLength;
          args->converter->charErrorBufferLength = cVar13 + '\x01';
          pUVar6->charErrorBuffer[cVar13] = uVar9;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        UVar12 = U_FAILURE(*err);
      } while (UVar12 == '\0');
    }
    else {
LAB_0038b4af:
      if (sourceLimit < pUVar3) {
        UVar2 = *sourceLimit;
        if ((UVar2 & 0xfc00U) == 0xdc00) {
          sourceLimit = sourceLimit + 1;
          local_48 = local_48 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
          *err = U_INVALID_CHAR_FOUND;
        }
        else {
          *err = U_ILLEGAL_CHAR_FOUND;
        }
      }
      else {
        *err = U_ZERO_ERROR;
      }
LAB_0038b52e:
      args->converter->fromUChar32 = local_48;
    }
LAB_0038b545:
    args->source = sourceLimit;
    args->target = (char *)targetLimit;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(
        UConverterFromUnicodeArgs * args, UErrorCode * err) {
    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UChar32 tempContextFromUnicode = 0x0000;    /* For special handling of the Gurmukhi script. */
    UConverterDataISCII *converterData;
    uint16_t newDelta=0;
    uint16_t range = 0;
    UBool deltaChanged = FALSE;

    if ((args->converter == NULL) || (args->targetLimit < args->target) || (args->sourceLimit < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    /* initialize data */
    converterData=(UConverterDataISCII*)args->converter->extraInfo;
    newDelta=converterData->currentDeltaFromUnicode;
    range = (uint16_t)(newDelta/DELTA);

    if ((sourceChar = args->converter->fromUChar32)!=0) {
        goto getTrail;
    }

    /*writing the char to the output stream */
    while (source < sourceLimit) {
        /* Write the language code following LF only if LF is not the last character. */
        if (args->converter->fromUnicodeStatus == LF) {
            targetByteUnit = ATR<<8;
            targetByteUnit += (uint8_t) lookupInitialData[range].isciiLang;
            args->converter->fromUnicodeStatus = 0x0000;
            /* now append ATR and language code */
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        }
        
        sourceChar = *source++;
        tempContextFromUnicode = converterData->contextCharFromUnicode;
        
        targetByteUnit = missingCharMarker;
        
        /*check if input is in ASCII and C0 control codes range*/
        if (sourceChar <= ASCII_END) {
            args->converter->fromUnicodeStatus = sourceChar;
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,sourceChar,err);
            if (U_FAILURE(*err)) {
                break;
            }
            continue;
        }
        switch (sourceChar) {
        case ZWNJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                converterData->contextCharFromUnicode = 0x00;
                targetByteUnit = ISCII_HALANT;
            } else {
                /* consume ZWNJ and continue */
                converterData->contextCharFromUnicode = 0x00;
                continue;
            }
            break;
        case ZWJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                targetByteUnit = ISCII_NUKTA;
            } else {
                targetByteUnit =ISCII_INV;
            }
            converterData->contextCharFromUnicode = 0x00;
            break;
        default:
            /* is the sourceChar in the INDIC_RANGE? */
            if ((uint16_t)(INDIC_BLOCK_END-sourceChar) <= INDIC_RANGE) {
                /* Danda and Double Danda are valid in Northern scripts.. since Unicode
                 * does not include these codepoints in all Northern scrips we need to
                 * filter them out
                 */
                if (sourceChar!= DANDA && sourceChar != DOUBLE_DANDA) {
                    /* find out to which block the souceChar belongs*/
                    range =(uint16_t)((sourceChar-INDIC_BLOCK_BEGIN)/DELTA);
                    newDelta =(uint16_t)(range*DELTA);

                    /* Now are we in the same block as the previous? */
                    if (newDelta!= converterData->currentDeltaFromUnicode || converterData->isFirstBuffer) {
                        converterData->currentDeltaFromUnicode = newDelta;
                        converterData->currentMaskFromUnicode = lookupInitialData[range].maskEnum;
                        deltaChanged =TRUE;
                        converterData->isFirstBuffer=FALSE;
                    }
                    
                    if (converterData->currentDeltaFromUnicode == PNJ_DELTA) { 
                        if (sourceChar == PNJ_TIPPI) {
                            /* Make sure Tippi is converterd to Bindi. */
                            sourceChar = PNJ_BINDI;
                        } else if (sourceChar == PNJ_ADHAK) {
                            /* This is for consonant cluster handling. */
                            converterData->contextCharFromUnicode = PNJ_ADHAK;
                        }
                        
                    }
                    /* Normalize all Indic codepoints to Devanagari and map them to ISCII */
                    /* now subtract the new delta from sourceChar*/
                    sourceChar -= converterData->currentDeltaFromUnicode;
                }

                /* get the target byte unit */
                targetByteUnit=fromUnicodeTable[(uint8_t)sourceChar];

                /* is the code point valid in current script? */
                if ((validityTable[(uint8_t)sourceChar] & converterData->currentMaskFromUnicode)==0) {
                    /* Vocallic RR is assigned in ISCII Telugu and Unicode */
                    if (converterData->currentDeltaFromUnicode!=(TELUGU_DELTA) || sourceChar!=VOCALLIC_RR) {
                        targetByteUnit=missingCharMarker;
                    }
                }

                if (deltaChanged) {
                    /* we are in a script block which is different than
                     * previous sourceChar's script block write ATR and language codes
                     */
                    uint32_t temp=0;
                    temp =(uint16_t)(ATR<<8);
                    temp += (uint16_t)((uint8_t) lookupInitialData[range].isciiLang);
                    /* reset */
                    deltaChanged=FALSE;
                    /* now append ATR and language code */
                    WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,temp,err);
                    if (U_FAILURE(*err)) {
                        break;
                    }
                }
                
                if (converterData->currentDeltaFromUnicode == PNJ_DELTA && (sourceChar + PNJ_DELTA) == PNJ_ADHAK) {
                    continue;
                }
            }
            /* reset context char */
            converterData->contextCharFromUnicode = 0x00;
            break;
        }
        if (converterData->currentDeltaFromUnicode == PNJ_DELTA && tempContextFromUnicode == PNJ_ADHAK && isPNJConsonant((sourceChar + PNJ_DELTA))) {
            /* If the previous codepoint is Adhak and the current codepoint is a consonant, the targetByteUnit should be C + Halant + C. */
            /* reset context char */
            converterData->contextCharFromUnicode = 0x0000;
            targetByteUnit = targetByteUnit << 16 | ISCII_HALANT << 8 | targetByteUnit;
            /* write targetByteUnit to target */
            WRITE_TO_TARGET_FROM_U(args, offsets, source, target, targetLimit, targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else if (targetByteUnit != missingCharMarker) {
            if (targetByteUnit==ISCII_HALANT) {
                converterData->contextCharFromUnicode = (UChar)targetByteUnit;
            }
            /* write targetByteUnit to target*/
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else {
            /* oops.. the code point is unassigned */
            /*check if the char is a First surrogate*/
            if (U16_IS_SURROGATE(sourceChar)) {
                if (U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if (source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail= (*source);
                        if (U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            *err =U_INVALID_CHAR_FOUND;
                            /* convert this surrogate code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                        }
                    } else {
                        /* no more input */
                        *err = U_ZERO_ERROR;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                }
            } else {
                /* callback(unassigned) for a BMP code point */
                *err = U_INVALID_CHAR_FOUND;
            }

            args->converter->fromUChar32=sourceChar;
            break;
        }
    }/* end while(mySourceIndex<mySourceLength) */

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}